

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<unsigned_int> __thiscall
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\xef'>,_kj::parse::ExactlyConst_<char,_'\xbb'>,_kj::parse::ExactlyConst_<char,_'\xbf'>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>::apply
          (Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_> *this,
          Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>
          *subParser,ParserInput *input)

{
  char *pcVar1;
  int iVar2;
  ParserInput subInput;
  undefined1 local_5a [26];
  char *local_40;
  char *local_38;
  
  iVar2 = 0;
  do {
    local_5a._10_8_ = (input->super_IteratorInput<char,_const_char_*>).pos;
    local_5a._18_8_ = (input->super_IteratorInput<char,_const_char_*>).end;
    if (local_5a._10_8_ == local_5a._18_8_) break;
    local_38 = input->begin;
    local_5a._2_8_ = input;
    local_40 = (char *)local_5a._10_8_;
    Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\xef'>,_kj::parse::ExactlyConst_<char,_'\xbb'>,_kj::parse::ExactlyConst_<char,_'\xbf'>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>
    ::parseNext<capnp::compiler::Lexer::ParserInput>
              ((Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>
                *)local_5a,(ParserInput *)subParser);
    if (local_5a[0] == '\x01') {
      ((IteratorInput<char,_const_char_*> *)local_5a._2_8_)->pos = (char *)local_5a._10_8_;
      iVar2 = iVar2 + 1;
    }
    else if ((ParserInput *)local_5a._2_8_ == (ParserInput *)0x0) break;
    if (local_40 < (ulong)local_5a._10_8_) {
      local_40 = (char *)local_5a._10_8_;
    }
    pcVar1 = ((IteratorInput<char,_const_char_*> *)local_5a._2_8_)->best;
    if (local_40 <= pcVar1) {
      local_40 = pcVar1;
    }
    ((IteratorInput<char,_const_char_*> *)local_5a._2_8_)->best = local_40;
  } while (local_5a[0] != '\0');
  *this = (Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>)0x1;
  *(int *)(this + 4) = iVar2;
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      if (kj::none != subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }

    if (atLeastOne && count == 0) {
      return kj::none;
    }

    return count;
  }